

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanStreamStart(Scanner *this)

{
  EncodingInfo EVar1;
  StringRef local_70;
  undefined1 local_60 [8];
  Token T;
  uint uStack_14;
  EncodingInfo EI;
  Scanner *this_local;
  
  this->IsStartOfStream = false;
  join_0x00000010_0x00000000_ = currentInput(this);
  EVar1 = getUnicodeEncoding(join_0x00000010_0x00000000_);
  Token::Token((Token *)local_60);
  local_60._0_4_ = TK_StreamStart;
  uStack_14 = EVar1.second;
  StringRef::StringRef(&local_70,this->Current,(ulong)uStack_14);
  T._0_8_ = local_70.Data;
  T.Range.Data = (char *)local_70.Length;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_60);
  this->Current = this->Current + uStack_14;
  Token::~Token((Token *)local_60);
  return true;
}

Assistant:

bool Scanner::scanStreamStart() {
  IsStartOfStream = false;

  EncodingInfo EI = getUnicodeEncoding(currentInput());

  Token T;
  T.Kind = Token::TK_StreamStart;
  T.Range = StringRef(Current, EI.second);
  TokenQueue.push_back(T);
  Current += EI.second;
  return true;
}